

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

string * __thiscall
glcts::ArraysOfArrays::InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>::
prepare_vertex_shader
          (string *__return_storage_ptr__,
          InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type,string *uniform_definition,string *uniform_use)

{
  TestError *this_00;
  string *uniform_use_local;
  string *uniform_definition_local;
  TestShaderType tested_shader_type_local;
  InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  string *vertex_shader_source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
  case GEOMETRY_SHADER_TYPE:
  case TESSELATION_CONTROL_SHADER_TYPE:
  case TESSELATION_EVALUATION_SHADER_TYPE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)default_vertex_shader_source_abi_cxx11_);
    break;
  case VERTEX_SHADER_TYPE:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)uniform_definition);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)shader_start_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)uniform_use);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"    gl_Position = vec4(result);\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)shader_end_abi_cxx11_);
    break;
  case COMPUTE_SHADER_TYPE:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader object type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x19e4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InteractionUniforms1<API>::prepare_vertex_shader(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& uniform_definition,
	const std::string& uniform_use)
{
	std::string vertex_shader_source;

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		break;

	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		vertex_shader_source = default_vertex_shader_source;
		break;

	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		/* User-defined function definition. */
		vertex_shader_source += uniform_definition;

		/* Main function definition. */
		vertex_shader_source += shader_start;
		vertex_shader_source += uniform_use;
		vertex_shader_source += "    gl_Position = vec4(result);\n";
		vertex_shader_source += shader_end;
		break;

	default:
		TCU_FAIL("Unrecognized shader object type.");
		break;
	}

	return vertex_shader_source;
}